

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessageDelimiter
          (ParserImpl *this,string *delimiter)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"<",&local_39);
  bVar1 = TryConsume(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_38,"{",&local_39);
    bVar1 = Consume(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar1) {
      return false;
    }
  }
  std::__cxx11::string::assign((char *)delimiter);
  return true;
}

Assistant:

bool ConsumeMessageDelimiter(std::string* delimiter) {
    if (TryConsume("<")) {
      *delimiter = ">";
    } else {
      DO(Consume("{"));
      *delimiter = "}";
    }
    return true;
  }